

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2xx(char *cval,char *dtype,LONGLONG *ival,int *lval,char *sval,double *dval,int *status)

{
  int *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  int *in_R8;
  char *in_R9;
  char *in_stack_00000038;
  int *in_stack_00000098;
  double *in_stack_000000a0;
  char *in_stack_000000a8;
  int *in_stack_ffffffffffffffc8;
  
  ffdtyp((char *)in_R8,in_R9,in_stack_ffffffffffffffc8);
  if (*in_RSI == 'I') {
    ffc2jj(in_stack_00000038,(LONGLONG *)cval,(int *)dtype);
  }
  else if (*in_RSI == 'F') {
    ffc2dd(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  }
  else if (*in_RSI == 'L') {
    ffc2ll(in_RDI,in_RCX,(int *)dval);
  }
  else {
    ffc2s(in_RDX,(char *)in_RCX,in_R8);
  }
  return *(int *)dval;
}

Assistant:

int ffc2xx(const char *cval,   /* I - formatted string representation of the value */
          char *dtype,         /* O - datatype code: C, L, F, I or X  */

    /* Only one of the following will be defined, depending on datatype */
          LONGLONG *ival, /* O - integer value       */
          int *lval,     /* O - logical value       */
          char *sval,    /* O - string value        */
          double *dval,  /* O - double value        */

          int *status)   /* IO - error status */
/*
  high level routine to convert formatted character string to its
  intrinsic data type
*/
{
    ffdtyp(cval, dtype, status);     /* determine the datatype */

    if (*dtype == 'I')
        ffc2jj(cval, ival, status);
    else if (*dtype == 'F')
        ffc2dd(cval, dval, status);
    else if (*dtype == 'L')
        ffc2ll(cval, lval, status);
    else 
        ffc2s(cval, sval, status);   /* C and X formats */
        
    return(*status);
}